

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

bool __thiscall FIX::Session::nextQueued(Session *this,int num,UtcTimeStamp *timeStamp)

{
  SessionState *this_00;
  bool bVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  signed_int value;
  MsgType msgType;
  Message msg;
  string local_220;
  string local_200;
  FieldBase local_1e0;
  Message local_180;
  
  Message::Message(&local_180);
  StringField::StringField((StringField *)&local_1e0,0x23);
  local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ea860;
  this_00 = &this->m_state;
  bVar1 = SessionState::retrieve(this_00,num,&local_180);
  if (bVar1) {
    IntConvertor::convert_abi_cxx11_(&local_200,(IntConvertor *)(ulong)(uint)num,value);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1c4e52);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_220.field_2._M_allocated_capacity = *psVar4;
      local_220.field_2._8_8_ = plVar3[3];
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar4;
      local_220._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_220._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    SessionState::onEvent(this_00,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    FieldMap::getField(&local_180.m_header.super_FieldMap,&local_1e0);
    iVar2 = std::__cxx11::string::compare((char *)&local_1e0.m_string);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_1e0.m_string);
      if (iVar2 != 0) {
        next(this,&local_180,timeStamp,true);
        goto LAB_001a4133;
      }
    }
    SessionState::incrNextTargetMsgSeqNum(this_00);
  }
LAB_001a4133:
  FieldBase::~FieldBase(&local_1e0);
  Message::~Message(&local_180);
  return bVar1;
}

Assistant:

bool Session::nextQueued( int num, const UtcTimeStamp& timeStamp )
{
  Message msg;
  MsgType msgType;

  if( m_state.retrieve( num, msg ) )
  {
    m_state.onEvent( "Processing QUEUED message: "
                     + IntConvertor::convert( num ) );
    msg.getHeader().getField( msgType );
    if( msgType == MsgType_Logon
        || msgType == MsgType_ResendRequest )
    {
      m_state.incrNextTargetMsgSeqNum();
    }
    else
    {
      next( msg, timeStamp, true );
    }
    return true;
  }
  return false;
}